

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

bool pugi::impl::anon_unknown_0::is_attribute_of(xml_attribute_struct *attr,xml_node_struct *node)

{
  xml_attribute_struct *local_28;
  xml_attribute_struct *a;
  xml_node_struct *node_local;
  xml_attribute_struct *attr_local;
  
  local_28 = node->first_attribute;
  while( true ) {
    if (local_28 == (xml_attribute_struct *)0x0) {
      return false;
    }
    if (local_28 == attr) break;
    local_28 = local_28->next_attribute;
  }
  return true;
}

Assistant:

PUGI__FN bool is_attribute_of(xml_attribute_struct* attr, xml_node_struct* node)
	{
		for (xml_attribute_struct* a = node->first_attribute; a; a = a->next_attribute)
			if (a == attr)
				return true;

		return false;
	}